

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFAsset.h
# Opt level: O0

void __thiscall glTF::Mesh::~Mesh(Mesh *this)

{
  bool bVar1;
  reference ppSVar2;
  _Self local_20;
  iterator it_end;
  iterator it;
  Mesh *this_local;
  
  (this->super_Object)._vptr_Object = (_func_int **)&PTR_IsSpecial_00f3de58;
  it_end = std::__cxx11::list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>::
           begin(&this->Extension);
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>::end
                 (&this->Extension);
  while( true ) {
    bVar1 = std::operator!=(&it_end,&local_20);
    if (!bVar1) break;
    ppSVar2 = std::_List_iterator<glTF::Mesh::SExtension_*>::operator*(&it_end);
    if (*ppSVar2 != (SExtension *)0x0) {
      (*(*ppSVar2)->_vptr_SExtension[1])();
    }
    std::_List_iterator<glTF::Mesh::SExtension_*>::operator++(&it_end,0);
  }
  std::__cxx11::list<glTF::Mesh::SExtension_*,_std::allocator<glTF::Mesh::SExtension_*>_>::~list
            (&this->Extension);
  std::vector<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>::~vector
            (&this->primitives);
  glTF::Object::~Object(&this->super_Object);
  return;
}

Assistant:

~Mesh() { for(std::list<SExtension*>::iterator it = Extension.begin(), it_end = Extension.end(); it != it_end; it++) { delete *it; }; }